

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superlu.c
# Opt level: O2

int main(int argc,char **argv)

{
  int i;
  double *pdVar1;
  int_t *rowind;
  int_t *colptr;
  long lVar2;
  int *perm_r;
  int *perm_c;
  int_t info;
  SuperMatrix B;
  SuperMatrix L;
  SuperMatrix A;
  SuperLUStat_t stat;
  SuperMatrix U;
  superlu_options_t options;
  
  pdVar1 = doubleMalloc(0xc);
  if (pdVar1 == (double *)0x0) {
    sprintf((char *)&options,"%s at line %d in file %s\n","Malloc fails for a[].",0x2e,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit((char *)&options);
  }
  rowind = intMalloc(0xc);
  if (rowind == (int_t *)0x0) {
    sprintf((char *)&options,"%s at line %d in file %s\n","Malloc fails for asub[].",0x2f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit((char *)&options);
  }
  colptr = intMalloc(6);
  if (colptr == (int_t *)0x0) {
    sprintf((char *)&options,"%s at line %d in file %s\n","Malloc fails for xa[].",0x30,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit((char *)&options);
  }
  *pdVar1 = 19.0;
  pdVar1[1] = 12.0;
  pdVar1[2] = 12.0;
  pdVar1[3] = 21.0;
  pdVar1[4] = 12.0;
  pdVar1[5] = 12.0;
  pdVar1[6] = 21.0;
  pdVar1[7] = 16.0;
  pdVar1[8] = 21.0;
  pdVar1[9] = 5.0;
  pdVar1[10] = 21.0;
  pdVar1[0xb] = 18.0;
  rowind[0] = 0;
  rowind[1] = 1;
  rowind[2] = 4;
  rowind[3] = 1;
  rowind[4] = 2;
  rowind[5] = 4;
  rowind[6] = 0;
  rowind[7] = 2;
  rowind[8] = 0;
  rowind[9] = 3;
  rowind[10] = 3;
  rowind[0xb] = 4;
  colptr[0] = 0;
  colptr[1] = 3;
  colptr[2] = 6;
  colptr[3] = 8;
  colptr[4] = 10;
  colptr[5] = 0xc;
  dCreate_CompCol_Matrix(&A,5,5,0xc,pdVar1,rowind,colptr,SLU_NC,SLU_D,SLU_GE);
  pdVar1 = doubleMalloc(5);
  if (pdVar1 == (double *)0x0) {
    sprintf((char *)&options,"%s at line %d in file %s\n","Malloc fails for rhs[].",0x3e,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit((char *)&options);
  }
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    pdVar1[lVar2] = 1.0;
  }
  dCreate_Dense_Matrix(&B,5,1,pdVar1,5,SLU_DN,SLU_D,SLU_GE);
  perm_r = int32Malloc(5);
  if (perm_r == (int *)0x0) {
    sprintf((char *)&options,"%s at line %d in file %s\n","Malloc fails for perm_r[].",0x43,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit((char *)&options);
  }
  perm_c = int32Malloc(5);
  if (perm_c == (int *)0x0) {
    sprintf((char *)&options,"%s at line %d in file %s\n","Malloc fails for perm_c[].",0x44,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/superlu.c"
           );
    superlu_abort_and_exit((char *)&options);
  }
  set_default_options(&options);
  options.ColPerm = NATURAL;
  StatInit(&stat);
  dgssv(&options,&A,perm_c,perm_r,&L,&U,&B,&stat,&info);
  dPrint_CompCol_Matrix("A",&A);
  dPrint_CompCol_Matrix("U",&U);
  dPrint_SuperNode_Matrix("L",&L);
  print_int_vec("\nperm_r",5,perm_r);
  superlu_free(pdVar1);
  superlu_free(perm_r);
  superlu_free(perm_c);
  Destroy_CompCol_Matrix(&A);
  Destroy_SuperMatrix_Store(&B);
  Destroy_SuperNode_Matrix(&L);
  Destroy_CompCol_Matrix(&U);
  StatFree(&stat);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    SuperMatrix A, L, U, B;
    double   *a, *rhs;
    double   s, u, p, e, r, l;
    int_t    *asub, *xa;
    int      *perm_r; /* row permutations from partial pivoting */
    int      *perm_c; /* column permutation vector */
    int      nrhs, m, n;
    int_t    info, nnz;
    superlu_options_t options;
    SuperLUStat_t stat;

    /* Initialize matrix A. */
    m = n = 5;
    nnz = 12;
    if ( !(a = doubleMalloc(nnz)) ) ABORT("Malloc fails for a[].");
    if ( !(asub = intMalloc(nnz)) ) ABORT("Malloc fails for asub[].");
    if ( !(xa = intMalloc(n+1)) ) ABORT("Malloc fails for xa[].");
    s = 19.0; u = 21.0; p = 16.0; e = 5.0; r = 18.0; l = 12.0;
    a[0] = s; a[1] = l; a[2] = l; a[3] = u; a[4] = l; a[5] = l;
    a[6] = u; a[7] = p; a[8] = u; a[9] = e; a[10]= u; a[11]= r;
    asub[0] = 0; asub[1] = 1; asub[2] = 4; asub[3] = 1;
    asub[4] = 2; asub[5] = 4; asub[6] = 0; asub[7] = 2;
    asub[8] = 0; asub[9] = 3; asub[10]= 3; asub[11]= 4;
    xa[0] = 0; xa[1] = 3; xa[2] = 6; xa[3] = 8; xa[4] = 10; xa[5] = 12;

    /* Create matrix A in the format expected by SuperLU. */
    dCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa, SLU_NC, SLU_D, SLU_GE);
    
    /* Create right-hand side matrix B. */
    nrhs = 1;
    if ( !(rhs = doubleMalloc(m * nrhs)) ) ABORT("Malloc fails for rhs[].");
    for (int i = 0; i < m; ++i)
        rhs[i] = 1.0;
    dCreate_Dense_Matrix(&B, m, nrhs, rhs, m, SLU_DN, SLU_D, SLU_GE);

    if ( !(perm_r = int32Malloc(m)) ) ABORT("Malloc fails for perm_r[].");
    if ( !(perm_c = int32Malloc(n)) ) ABORT("Malloc fails for perm_c[].");

    /* Set the default input options. */
    set_default_options(&options);
    options.ColPerm = NATURAL;

    /* Initialize the statistics variables. */
    StatInit(&stat);

    /* Solve the linear system. */
    dgssv(&options, &A, perm_c, perm_r, &L, &U, &B, &stat, &info);
    
    dPrint_CompCol_Matrix("A", &A);
    dPrint_CompCol_Matrix("U", &U);
    dPrint_SuperNode_Matrix("L", &L);
    print_int_vec("\nperm_r", m, perm_r);

    /* De-allocate storage */
    SUPERLU_FREE (rhs);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    Destroy_CompCol_Matrix(&A);
    Destroy_SuperMatrix_Store(&B);
    Destroy_SuperNode_Matrix(&L);
    Destroy_CompCol_Matrix(&U);
    StatFree(&stat);

    return EXIT_SUCCESS;
}